

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitStringTest_x_iutest_x_FormatSizeGByte_Test::Body
          (iu_UnitStringTest_x_iutest_x_FormatSizeGByte_Test *this)

{
  UInt64 in_RDX;
  AssertionResult iutest_ar;
  type **in_stack_fffffffffffffde8;
  allocator<char> local_209;
  AssertionResult local_208;
  AssertionHelper local_1e0;
  string local_1b0;
  undefined1 local_190 [392];
  
  iutest::detail::FormatSizeByte_abi_cxx11_(&local_1b0,(detail *)0x40000000,in_RDX);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_208,(internal *)"\"1GB\"","::iutest::detail::FormatSizeByte(1024 * 1024 * 1024)"
             ,"1GB",(char *)&local_1b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffde8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,local_208.m_message._M_dataplus._M_p,&local_209);
    local_1e0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_1e0.m_part_result.super_iuCodeMessage.m_line = 0x10e;
    local_1e0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e0,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_message._M_dataplus._M_p != &local_208.m_message.field_2) {
    operator_delete(local_208.m_message._M_dataplus._M_p,
                    local_208.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, FormatSizeGByte)
{
    IUTEST_EXPECT_STREQ("1GB", ::iutest::detail::FormatSizeByte(1024 * 1024 * 1024));
}